

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O3

int secp256k1_keyagg_cache_load
              (secp256k1_context *ctx,secp256k1_keyagg_cache_internal *cache_i,
              secp256k1_musig_keyagg_cache *cache)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_58;
  
  lVar4 = 0;
  do {
    if (cache->data[lVar4] != secp256k1_musig_keyagg_cache_magic[lVar4]) {
      (*(ctx->illegal_callback).fn)
                ("secp256k1_memcmp_var(ptr, secp256k1_musig_keyagg_cache_magic, 4) == 0",
                 (ctx->illegal_callback).data);
      return 0;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  local_58.x.n[0] = *(uint64_t *)(cache->data + 4);
  local_58.x.n[1] = *(uint64_t *)(cache->data + 0xc);
  local_58.x.n[2] = *(uint64_t *)(cache->data + 0x14);
  local_58.x.n[3] = *(uint64_t *)(cache->data + 0x1c);
  local_58.y.n[0] = *(uint64_t *)(cache->data + 0x24);
  local_58.y.n[1] = *(uint64_t *)(cache->data + 0x2c);
  local_58.y.n[2] = *(uint64_t *)(cache->data + 0x34);
  local_58.y.n[3] = *(uint64_t *)(cache->data + 0x3c);
  secp256k1_ge_from_storage(&cache_i->pk,&local_58);
  secp256k1_ge_from_bytes_ext(&cache_i->second_pk,cache->data + 0x44);
  uVar1 = *(undefined8 *)(cache->data + 0x84);
  uVar2 = *(undefined8 *)(cache->data + 0x8c);
  uVar3 = *(undefined8 *)(cache->data + 0x9c);
  *(undefined8 *)(cache_i->pks_hash + 0x10) = *(undefined8 *)(cache->data + 0x94);
  *(undefined8 *)(cache_i->pks_hash + 0x18) = uVar3;
  *(undefined8 *)cache_i->pks_hash = uVar1;
  *(undefined8 *)(cache_i->pks_hash + 8) = uVar2;
  cache_i->parity_acc = cache->data[0xa4] & 1;
  secp256k1_scalar_set_b32(&cache_i->tweak,cache->data + 0xa5,(int *)0x0);
  return 1;
}

Assistant:

static int secp256k1_keyagg_cache_load(const secp256k1_context* ctx, secp256k1_keyagg_cache_internal *cache_i, const secp256k1_musig_keyagg_cache *cache) {
    const unsigned char *ptr = cache->data;
    ARG_CHECK(secp256k1_memcmp_var(ptr, secp256k1_musig_keyagg_cache_magic, 4) == 0);
    ptr += 4;
    secp256k1_ge_from_bytes(&cache_i->pk, ptr);
    ptr += 64;
    secp256k1_ge_from_bytes_ext(&cache_i->second_pk, ptr);
    ptr += 64;
    memcpy(cache_i->pks_hash, ptr, 32);
    ptr += 32;
    cache_i->parity_acc = *ptr & 1;
    ptr += 1;
    secp256k1_scalar_set_b32(&cache_i->tweak, ptr, NULL);
    return 1;
}